

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodePushing.cpp
# Opt level: O0

void __thiscall wasm::CodePushing::visitBlock(CodePushing *this,Block *curr)

{
  __node_base_ptr block;
  size_t sVar1;
  PassOptions *passOptions;
  Module *module;
  undefined1 local_78 [8];
  Pusher pusher;
  Block *curr_local;
  CodePushing *this_local;
  
  pusher.pushableEffects._M_h._M_single_bucket = (__node_base_ptr)curr;
  sVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                    (&(curr->list).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  block = pusher.pushableEffects._M_h._M_single_bucket;
  if (1 < sVar1) {
    passOptions = Pass::getPassOptions((Pass *)this);
    module = Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::getModule
                       (&(this->
                         super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                         ).
                         super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>
                         .super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>);
    Pusher::Pusher((Pusher *)local_78,(Block *)block,&this->analyzer,&this->numGetsSoFar,passOptions
                   ,module);
    Pusher::~Pusher((Pusher *)local_78);
  }
  return;
}

Assistant:

void visitBlock(Block* curr) {
    // Pushing code only makes sense if we are size 2 or above: we need one
    // element to push and an element to push it into, at minimum.
    if (curr->list.size() < 2) {
      return;
    }
    // At this point in the postorder traversal we have gone through all our
    // children. Therefore any variable whose gets seen so far is equal to the
    // total gets must have no further users after this block. And therefore
    // when we see an SFA variable defined here, we know it isn't used before it
    // either, and has just this one assign. So we can push it forward while we
    // don't hit a non-control-flow ordering invalidation issue, since if this
    // isn't a loop, it's fine (we're not used outside), and if it is, we hit
    // the assign before any use (as we can't push it past a use).
    Pusher pusher(curr, analyzer, numGetsSoFar, getPassOptions(), *getModule());
  }